

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.h
# Opt level: O3

anon_class_24_3_67308ef9 * __thiscall
google::protobuf::internal::ExtensionSet::
ForEach<std::_Rb_tree_iterator<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>,google::protobuf::internal::ExtensionSet::AppendToList(google::protobuf::Descriptor_const*,google::protobuf::DescriptorPool_const*,std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>*)const::__0>
          (anon_class_24_3_67308ef9 *__return_storage_ptr__,ExtensionSet *this,
          _Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
          begin,_Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
                end,anon_class_24_3_67308ef9 func)

{
  _Rb_tree_color number;
  vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
  *this_00;
  int iVar1;
  _Base_ptr in_RAX;
  _Base_ptr p_Var2;
  iterator __position;
  _Base_ptr local_38;
  
  local_38 = in_RAX;
  if ((_Base_ptr)this != begin._M_node) {
    do {
      number = ((_Rb_tree_node_base *)((long)this + 0x20))->_M_color;
      if (*(char *)((long)&((_Rb_tree_node_base *)((long)this + 0x20))->_M_left + 1) == '\x01') {
        iVar1 = Extension::GetSize((Extension *)
                                   &((_Rb_tree_node_base *)((long)this + 0x20))->_M_parent);
        if (0 < iVar1) {
LAB_002f54e1:
          p_Var2 = ((_Rb_tree_node_base *)((long)this + 0x20))->_M_right;
          this_00 = (vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
                     *)*func.output;
          if (p_Var2 == (_Base_ptr)0x0) {
            p_Var2 = (_Base_ptr)
                     DescriptorPool::FindExtensionByNumber(func.pool,func.containing_type,number);
            __position._M_current = *(FieldDescriptor ***)(this_00 + 8);
            local_38 = p_Var2;
            if (__position._M_current != *(FieldDescriptor ***)(this_00 + 0x10)) goto LAB_002f5528;
            std::
            vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
            ::_M_realloc_insert<google::protobuf::FieldDescriptor_const*>
                      (this_00,__position,(FieldDescriptor **)&local_38);
          }
          else {
            __position._M_current = *(FieldDescriptor ***)(this_00 + 8);
            if (__position._M_current == *(FieldDescriptor ***)(this_00 + 0x10)) {
              std::
              vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
              ::_M_realloc_insert<google::protobuf::FieldDescriptor_const*const&>
                        (this_00,__position,
                         (FieldDescriptor **)&((_Rb_tree_node_base *)((long)this + 0x20))->_M_right)
              ;
            }
            else {
LAB_002f5528:
              *__position._M_current = (FieldDescriptor *)p_Var2;
              *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
            }
          }
        }
      }
      else if (((ulong)((_Rb_tree_node_base *)((long)this + 0x20))->_M_left & 0x10000) == 0)
      goto LAB_002f54e1;
      this = (ExtensionSet *)std::_Rb_tree_increment((_Rb_tree_node_base *)this);
    } while ((_Base_ptr)this != begin._M_node);
  }
  __return_storage_ptr__->output = func.output;
  __return_storage_ptr__->containing_type = func.containing_type;
  __return_storage_ptr__->pool = func.pool;
  return (anon_class_24_3_67308ef9 *)func.output;
}

Assistant:

static KeyValueFunctor ForEach(Iterator begin, Iterator end,
                                 KeyValueFunctor func) {
    for (Iterator it = begin; it != end; ++it) func(it->first, it->second);
    return std::move(func);
  }